

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_prepare_locations(Parser *this)

{
  char *pcVar1;
  size_t *psVar2;
  ulong uVar3;
  size_t sVar4;
  pfn_error p_Var5;
  code *pcVar6;
  Location LVar7;
  bool bVar8;
  size_t sVar9;
  size_t i;
  ulong uVar10;
  csubstr cVar11;
  char *pcStack_68;
  size_t local_60;
  char msg [54];
  
  sVar9 = (this->m_buf).len;
  (this->m_newline_offsets_buf).str = (this->m_buf).str;
  (this->m_newline_offsets_buf).len = sVar9;
  sVar9 = basic_substring<char>::count(&this->m_buf,'\n',0);
  _resize_locations(this,sVar9 + 1);
  this->m_newline_offsets_size = 0;
  pcVar1 = (this->m_buf).str;
  psVar2 = this->m_newline_offsets;
  for (uVar10 = 0; uVar3 = (this->m_buf).len, uVar10 < uVar3; uVar10 = uVar10 + 1) {
    if (pcVar1[uVar10] == '\n') {
      sVar4 = this->m_newline_offsets_size;
      this->m_newline_offsets_size = sVar4 + 1;
      psVar2[sVar4] = uVar10;
    }
  }
  sVar4 = this->m_newline_offsets_size;
  this->m_newline_offsets_size = sVar4 + 1;
  this->m_newline_offsets[sVar4] = uVar3;
  if (this->m_newline_offsets_size != sVar9 + 1) {
    builtin_strncpy(msg,"check failed: (m_newline_offsets_size == numnewlines)",0x36);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    p_Var5 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar11.len;
    pcStack_68 = cVar11.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x8052) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x8052) << 0x40,8);
    LVar7.name.str = pcStack_68;
    LVar7.name.len = local_60;
    (*p_Var5)(msg,0x36,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  return;
}

Assistant:

void Parser::_prepare_locations()
{
    m_newline_offsets_buf = m_buf;
    size_t numnewlines = 1u + m_buf.count('\n');
    _resize_locations(numnewlines);
    m_newline_offsets_size = 0;
    for(size_t i = 0; i < m_buf.len; i++)
        if(m_buf[i] == '\n')
            m_newline_offsets[m_newline_offsets_size++] = i;
    m_newline_offsets[m_newline_offsets_size++] = m_buf.len;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size == numnewlines);
}